

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.hpp
# Opt level: O2

int levenshtein_distance(string *s1,string *s2)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  initializer_list<int> __l;
  int local_7c;
  int local_78;
  int local_74;
  long local_70;
  ulong local_68;
  ulong local_60;
  string *local_58;
  undefined4 *local_50;
  string *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar10 = s1->_M_string_length;
  sVar4 = s2->_M_string_length;
  lVar8 = (uVar10 << 0x20) + 0x100000000;
  uVar12 = 0xffffffffffffffff;
  if (-1 < lVar8) {
    uVar12 = lVar8 >> 0x1e;
  }
  local_48 = s1;
  puVar9 = (undefined4 *)operator_new__(uVar12);
  lVar8 = 1;
  local_70 = (long)(uVar10 << 0x20) >> 0x1e;
  for (lVar11 = local_70; lVar11 != 0; lVar11 = lVar11 + -4) {
    puVar9[lVar8] = (int)lVar8;
    lVar8 = lVar8 + 1;
  }
  local_38 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    local_38 = 0;
  }
  iVar5 = (int)sVar4;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  local_68 = (ulong)(iVar5 + 1);
  uVar10 = 1;
  local_58 = s2;
  local_50 = puVar9;
  while (uVar10 != local_68) {
    *puVar9 = (int)uVar10;
    local_40 = uVar10 - 1;
    uVar13 = uVar10 & 0xffffffff;
    uVar14 = local_40 & 0xffffffff;
    local_60 = uVar10;
    for (uVar12 = 0; local_38 != uVar12; uVar12 = uVar12 + 1) {
      uVar3 = puVar9[uVar12 + 1];
      cVar1 = (local_48->_M_dataplus)._M_p[uVar12];
      cVar2 = (s2->_M_dataplus)._M_p[local_40];
      iVar5 = 0;
      if (cVar1 != cVar2) {
        iVar5 = tolower((int)cVar1);
        iVar6 = tolower((int)cVar2);
        iVar5 = (iVar5 != iVar6) + 1;
        s2 = local_58;
      }
      local_74 = iVar5 + (int)uVar14;
      local_7c = uVar3 + 4;
      local_78 = (int)uVar13 + 4;
      __l._M_len = 3;
      __l._M_array = &local_7c;
      uVar7 = std::min<int>(__l);
      uVar13 = (ulong)uVar7;
      local_50[uVar12 + 1] = uVar7;
      uVar14 = (ulong)uVar3;
      puVar9 = local_50;
    }
    uVar10 = local_60 + 1;
  }
  iVar5 = *(int *)((long)puVar9 + local_70);
  operator_delete__(puVar9);
  return iVar5;
}

Assistant:

int levenshtein_distance(const std::string &s1, const std::string &s2) {
  // To change the type this function manipulates and returns, change
  // the return type and the types of the two variables below.
  int s1len = s1.size();
  int s2len = s2.size();

  int column_start = 1;

  int *column = new int[s1len + 1];
  std::iota(column + column_start, column + s1len + 1, column_start);

  constexpr int insert_cost = 4;
  constexpr int change_cost = 2;
  constexpr int capitalize_cost = 1;

  for (int x = column_start; x <= s2len; x++) {
    column[0] = x;
    int last_diagonal = x - column_start;
    for (int y = column_start; y <= s1len; y++) {
      int old_diagonal = column[y];

      char c1 = s1[y - 1];
      char c2 = s2[x - 1];
      int diff_cost;
      if (c1 == c2) {
        diff_cost = 0;
      } else if (std::tolower(c1) == std::tolower(c2)) {
        diff_cost = capitalize_cost;
      } else {
        diff_cost = change_cost;
      }

      // clang-format off
      column[y] = std::min({
        column[y] + insert_cost,
        column[y - 1] + insert_cost,
        last_diagonal + diff_cost
      });
      // clang-format on
      last_diagonal = old_diagonal;
    }
  }
  int result = column[s1len];
  delete[] column;
  return result;
}